

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddTexCoord
          (X3DImporter *this,aiMesh *pMesh,vector<int,_std::allocator<int>_> *pCoordIdx,
          vector<int,_std::allocator<int>_> *pTexCoordIdx,
          list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords)

{
  pointer *this_00;
  float fVar1;
  uint uVar2;
  bool bVar3;
  size_type sVar4;
  reference paVar5;
  DeadlyImportError *pDVar6;
  ulong uVar7;
  aiVector3D *paVar8;
  reference pvVar9;
  reference pvVar10;
  aiVector3t<float> *local_1d0;
  size_t tc_idx;
  size_t vert_idx;
  size_t ii;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  ulong local_f8;
  size_t fi_e;
  size_t fi;
  string local_e0;
  undefined1 local_ba;
  allocator<char> local_b9;
  string local_b8;
  aiVector3t<float> local_94;
  _Self local_88;
  _Self local_80;
  const_iterator it;
  uint local_64;
  undefined1 local_60 [4];
  uint prim_type;
  vector<aiFace,_std::allocator<aiFace>_> faces;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> texcoord_arr_copy;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pTexCoords_local;
  vector<int,_std::allocator<int>_> *pTexCoordIdx_local;
  vector<int,_std::allocator<int>_> *pCoordIdx_local;
  aiMesh *pMesh_local;
  X3DImporter *this_local;
  
  this_00 = &faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00);
  std::vector<aiFace,_std::allocator<aiFace>_>::vector
            ((vector<aiFace,_std::allocator<aiFace>_> *)local_60);
  sVar4 = std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::size
                    (pTexCoords);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)this_00,sVar4);
  local_80._M_node =
       (_List_node_base *)
       std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::begin(pTexCoords)
  ;
  while( true ) {
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::end(pTexCoords)
    ;
    bVar3 = std::operator!=(&local_80,&local_88);
    if (!bVar3) break;
    paVar5 = std::_List_const_iterator<aiVector2t<float>_>::operator*(&local_80);
    fVar1 = paVar5->x;
    paVar5 = std::_List_const_iterator<aiVector2t<float>_>::operator*(&local_80);
    aiVector3t<float>::aiVector3t(&local_94,fVar1,paVar5->y,0.0);
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
               &faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_94);
    std::_List_const_iterator<aiVector2t<float>_>::operator++(&local_80);
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size(pTexCoordIdx);
  if (sVar4 == 0) {
    GeometryHelper_CoordIdxStr2FacesArr
              (this,pCoordIdx,(vector<aiFace,_std::allocator<aiFace>_> *)local_60,&local_64);
  }
  else {
    GeometryHelper_CoordIdxStr2FacesArr
              (this,pTexCoordIdx,(vector<aiFace,_std::allocator<aiFace>_> *)local_60,&local_64);
    bVar3 = std::vector<aiFace,_std::allocator<aiFace>_>::empty
                      ((vector<aiFace,_std::allocator<aiFace>_> *)local_60);
    if (bVar3) {
      local_ba = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 "Failed to add texture coordinates to mesh, faces list is empty.",&local_b9);
      DeadlyImportError::DeadlyImportError(pDVar6,&local_b8);
      local_ba = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    sVar4 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                      ((vector<aiFace,_std::allocator<aiFace>_> *)local_60);
    if (sVar4 != pMesh->mNumFaces) {
      fi._6_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "Texture coordinates faces count must be equal to mesh faces count.",
                 (allocator<char> *)((long)&fi + 7));
      DeadlyImportError::DeadlyImportError(pDVar6,&local_e0);
      fi._6_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
  }
  uVar7 = (ulong)pMesh->mNumVertices;
  paVar8 = (aiVector3D *)operator_new__(uVar7 * 0xc);
  if (uVar7 != 0) {
    local_1d0 = paVar8;
    do {
      aiVector3t<float>::aiVector3t(local_1d0);
      local_1d0 = local_1d0 + 1;
    } while (local_1d0 != paVar8 + uVar7);
  }
  pMesh->mTextureCoords[0] = paVar8;
  pMesh->mNumUVComponents[0] = 2;
  fi_e = 0;
  local_f8 = std::vector<aiFace,_std::allocator<aiFace>_>::size
                       ((vector<aiFace,_std::allocator<aiFace>_> *)local_60);
  while( true ) {
    if (local_f8 <= fi_e) {
      std::vector<aiFace,_std::allocator<aiFace>_>::~vector
                ((vector<aiFace,_std::allocator<aiFace>_> *)local_60);
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                 &faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
    uVar2 = pMesh->mFaces[fi_e].mNumIndices;
    pvVar9 = std::vector<aiFace,_std::allocator<aiFace>_>::at
                       ((vector<aiFace,_std::allocator<aiFace>_> *)local_60,fi_e);
    if (uVar2 != pvVar9->mNumIndices) break;
    for (vert_idx = 0; vert_idx < pMesh->mFaces[fi_e].mNumIndices; vert_idx = vert_idx + 1) {
      uVar2 = pMesh->mFaces[fi_e].mIndices[vert_idx];
      pvVar9 = std::vector<aiFace,_std::allocator<aiFace>_>::at
                         ((vector<aiFace,_std::allocator<aiFace>_> *)local_60,fi_e);
      pvVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::at
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &faces.super__Vector_base<aiFace,_std::allocator<aiFace>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (ulong)pvVar9->mIndices[vert_idx]);
      paVar8 = pMesh->mTextureCoords[0] + uVar2;
      fVar1 = pvVar10->y;
      paVar8->x = pvVar10->x;
      paVar8->y = fVar1;
      paVar8->z = pvVar10->z;
    }
    fi_e = fi_e + 1;
  }
  pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  to_string<unsigned_long>(&local_158,fi_e);
  std::operator+(&local_138,
                 "Number of indices in texture face and mesh face must be equal. Invalid face index: "
                 ,&local_158);
  std::operator+(&local_118,&local_138,".");
  DeadlyImportError::DeadlyImportError(pDVar6,&local_118);
  __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void X3DImporter::MeshGeometry_AddTexCoord(aiMesh& pMesh, const std::vector<int32_t>& pCoordIdx, const std::vector<int32_t>& pTexCoordIdx,
								const std::list<aiVector2D>& pTexCoords) const
{
    std::vector<aiVector3D> texcoord_arr_copy;
    std::vector<aiFace> faces;
    unsigned int prim_type;

	// copy list to array because we are need indexed access to normals.
	texcoord_arr_copy.reserve(pTexCoords.size());
	for(std::list<aiVector2D>::const_iterator it = pTexCoords.begin(); it != pTexCoords.end(); ++it)
	{
		texcoord_arr_copy.push_back(aiVector3D((*it).x, (*it).y, 0));
	}

	if(pTexCoordIdx.size() > 0)
	{
		GeometryHelper_CoordIdxStr2FacesArr(pTexCoordIdx, faces, prim_type);
        if ( faces.empty() )
        {
            throw DeadlyImportError( "Failed to add texture coordinates to mesh, faces list is empty." );
        }
        if ( faces.size() != pMesh.mNumFaces )
        {
            throw DeadlyImportError( "Texture coordinates faces count must be equal to mesh faces count." );
        }
	}
	else
	{
		GeometryHelper_CoordIdxStr2FacesArr(pCoordIdx, faces, prim_type);
	}

	pMesh.mTextureCoords[0] = new aiVector3D[pMesh.mNumVertices];
	pMesh.mNumUVComponents[0] = 2;
	for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
	{
		if(pMesh.mFaces[fi].mNumIndices != faces.at(fi).mNumIndices)
			throw DeadlyImportError("Number of indices in texture face and mesh face must be equal. Invalid face index: " + to_string(fi) + ".");

		for(size_t ii = 0; ii < pMesh.mFaces[fi].mNumIndices; ii++)
		{
			size_t vert_idx = pMesh.mFaces[fi].mIndices[ii];
			size_t tc_idx = faces.at(fi).mIndices[ii];

			pMesh.mTextureCoords[0][vert_idx] = texcoord_arr_copy.at(tc_idx);
		}
	}// for(size_t fi = 0, fi_e = faces.size(); fi < fi_e; fi++)
}